

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O2

void __thiscall
duckdb::TableScanGlobalSourceState::TableScanGlobalSourceState
          (TableScanGlobalSourceState *this,ClientContext *context,PhysicalTableScan *op)

{
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
  *this_00;
  DataChunk *this_01;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> bind_data_p;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var1;
  pointer pVVar2;
  undefined8 __p;
  bool bVar3;
  int iVar4;
  DynamicTableFilterSet *this_02;
  PhysicalTableScan *scan;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> filters_p;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> _Var5;
  pointer pGVar6;
  undefined4 extraout_var;
  reference this_03;
  const_reference val;
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> *this_04;
  Value *param;
  pointer __x;
  ulong __n;
  TableFunctionInitInput input;
  undefined1 local_c0 [40];
  __native_type local_98 [2];
  
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GlobalSourceState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GlobalSourceState)._vptr_GlobalSourceState =
       (_func_int **)&PTR__TableScanGlobalSourceState_027bebf0;
  this_00 = &this->global_state;
  this_01 = &this->input_chunk;
  this->max_threads = 0;
  (this->global_state).
  super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (GlobalTableFunctionState *)0x0;
  this->in_out_final = false;
  local_c0._8_8_ = context;
  DataChunk::DataChunk(this_01);
  (this->table_filters).
  super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>.
  super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl = (TableFilterSet *)0x0;
  this_04 = &this->table_filters;
  if ((op->dynamic_filters).internal.
      super___shared_ptr<duckdb::DynamicTableFilterSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_02 = shared_ptr<duckdb::DynamicTableFilterSet,_true>::operator->(&op->dynamic_filters);
    bVar3 = DynamicTableFilterSet::HasFilters(this_02);
    if (bVar3) {
      scan = (PhysicalTableScan *)
             shared_ptr<duckdb::DynamicTableFilterSet,_true>::operator->(&op->dynamic_filters);
      DynamicTableFilterSet::GetFinalTableFilters
                ((DynamicTableFilterSet *)&local_98[0].__data,scan,
                 (optional_ptr<duckdb::TableFilterSet,_true>)op);
      __p = local_98[0].__align;
      local_98[0].__align = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
      reset((__uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_> *
            )this_04,(pointer)__p);
      ::std::unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>::
      ~unique_ptr((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
                   *)&local_98[0].__data);
    }
  }
  if ((op->function).init_global == (table_function_init_global_t)0x0) {
    this->max_threads = 1;
  }
  else {
    if ((this_04->
        super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)._M_t
        .super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
        .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl ==
        (TableFilterSet *)0x0) {
      filters_p._M_head_impl =
           (op->table_filters).
           super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
           .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
    }
    else {
      filters_p._M_head_impl =
           unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>::
           operator*(this_04);
    }
    bind_data_p._M_head_impl =
         (op->bind_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::vector
              ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
               (local_c0 + 0x10),
               &(op->column_ids).
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
    TableFunctionInitInput::TableFunctionInitInput
              ((TableFunctionInitInput *)&local_98[0].__data,
               (optional_ptr<const_duckdb::FunctionData,_true>)bind_data_p._M_head_impl,
               (vector<duckdb::ColumnIndex,_true> *)(local_c0 + 0x10),&op->projection_ids,
               (optional_ptr<duckdb::TableFilterSet,_true>)filters_p._M_head_impl,
               (optional_ptr<duckdb::SampleOptions,_true>)
               (op->extra_info).sample_options.
               super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
               .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl);
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
              ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
               (local_c0 + 0x10));
    (*(op->function).init_global)
              ((ClientContext *)local_c0,(TableFunctionInitInput *)local_c0._8_8_);
    _Var5._M_head_impl = (GlobalTableFunctionState *)local_c0._0_8_;
    local_c0._0_8_ = (element_type *)0x0;
    _Var1._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
         .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
    (this_00->
    super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
    .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
         _Var5._M_head_impl;
    if (_Var1._M_head_impl != (GlobalTableFunctionState *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_GlobalTableFunctionState[1])();
      if ((element_type *)local_c0._0_8_ != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_c0._0_8_)->
                    __weak_this_).internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      _Var5._M_head_impl =
           (this_00->
           super_unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
           .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
    }
    if (_Var5._M_head_impl != (GlobalTableFunctionState *)0x0) {
      pGVar6 = unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
               ::operator->(this_00);
      iVar4 = (*pGVar6->_vptr_GlobalTableFunctionState[2])(pGVar6);
      this->max_threads = CONCAT44(extraout_var,iVar4);
    }
    TableFunctionInitInput::~TableFunctionInitInput((TableFunctionInitInput *)&local_98[0].__data);
  }
  if ((op->function).in_out_function != (table_in_out_function_t)0x0) {
    local_98[0]._16_8_ = 0;
    local_98[0].__align = 0;
    local_98[0]._8_8_ = 0;
    pVVar2 = (op->parameters).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__x = (op->parameters).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start; __x != pVVar2; __x = __x + 1) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 &local_98[0].__data,&__x->type_);
    }
    DataChunk::Initialize
              (this_01,(ClientContext *)local_c0._8_8_,
               (vector<duckdb::LogicalType,_true> *)&local_98[0].__data,0x800);
    for (__n = 0; __n < (ulong)((long)(op->parameters).
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(op->parameters).
                                      super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 6); __n = __n + 1
        ) {
      this_03 = vector<duckdb::Vector,_true>::get<true>(&this_01->data,__n);
      val = vector<duckdb::Value,_true>::get<true>(&op->parameters,__n);
      Vector::SetValue(this_03,0,val);
    }
    (this->input_chunk).count = 1;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &local_98[0].__data);
  }
  return;
}

Assistant:

TableScanGlobalSourceState(ClientContext &context, const PhysicalTableScan &op) {
		if (op.dynamic_filters && op.dynamic_filters->HasFilters()) {
			table_filters = op.dynamic_filters->GetFinalTableFilters(op, op.table_filters.get());
		}

		if (op.function.init_global) {
			auto filters = table_filters ? *table_filters : GetTableFilters(op);
			TableFunctionInitInput input(op.bind_data.get(), op.column_ids, op.projection_ids, filters,
			                             op.extra_info.sample_options);

			global_state = op.function.init_global(context, input);
			if (global_state) {
				max_threads = global_state->MaxThreads();
			}
		} else {
			max_threads = 1;
		}
		if (op.function.in_out_function) {
			// this is an in-out function, we need to setup the input chunk
			vector<LogicalType> input_types;
			for (auto &param : op.parameters) {
				input_types.push_back(param.type());
			}
			input_chunk.Initialize(context, input_types);
			for (idx_t c = 0; c < op.parameters.size(); c++) {
				input_chunk.data[c].SetValue(0, op.parameters[c]);
			}
			input_chunk.SetCardinality(1);
		}
	}